

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void test_resumption(void)

{
  ptls_context_t *ppVar1;
  ptls_iovec_t ticket;
  ptls_iovec_t ticket_00;
  ptls_iovec_t ticket_01;
  ptls_save_ticket_t st;
  ptls_encrypt_ticket_t et;
  
  ppVar1 = ctx_peer;
  et.cb = copy_ticket;
  st.cb = save_ticket;
  if (ctx_peer->ticket_lifetime != 0) {
    __assert_fail("ctx_peer->ticket_lifetime == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
                  ,0x11a,"void test_resumption(void)");
  }
  if (ctx_peer->max_early_data_size != 0) {
    __assert_fail("ctx_peer->max_early_data_size == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
                  ,0x11b,"void test_resumption(void)");
  }
  if (ctx_peer->encrypt_ticket != (ptls_encrypt_ticket_t *)0x0) {
    __assert_fail("ctx_peer->encrypt_ticket == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
                  ,0x11c,"void test_resumption(void)");
  }
  if (ctx_peer->decrypt_ticket == (ptls_encrypt_ticket_t *)0x0) {
    if (ctx_peer->save_ticket == (ptls_save_ticket_t *)0x0) {
      saved_ticket_0 = (uint8_t *)0x0;
      saved_ticket_1 = 0;
      ppVar1->ticket_lifetime = 0x15180;
      ppVar1->max_early_data_size = 0x2000;
      ppVar1->encrypt_ticket = &et;
      ppVar1->decrypt_ticket = &et;
      ctx->save_ticket = &st;
      lc_callcnt = 0;
      test_handshake((ptls_iovec_t)ZEXT816(0),0);
      _ok((uint)(lc_callcnt == 1),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
          ,0x129);
      _ok((uint)(saved_ticket_0 != (uint8_t *)0x0),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
          ,0x12a);
      ticket.len = saved_ticket_1;
      ticket.base = saved_ticket_0;
      test_handshake(ticket,0);
      _ok((uint)(lc_callcnt == 1),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
          ,0x12e);
      ctx->require_dhe_on_psk = 1;
      ticket_00.len = saved_ticket_1;
      ticket_00.base = saved_ticket_0;
      test_handshake(ticket_00,0);
      _ok((uint)(lc_callcnt == 1),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
          ,0x133);
      ctx->require_dhe_on_psk = 0;
      ticket_01.len = saved_ticket_1;
      ticket_01.base = saved_ticket_0;
      test_handshake(ticket_01,1);
      ppVar1 = ctx_peer;
      ppVar1->ticket_lifetime = 0;
      ppVar1->max_early_data_size = 0;
      ppVar1->encrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
      ppVar1->decrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
      ctx->save_ticket = (ptls_save_ticket_t *)0x0;
      return;
    }
    __assert_fail("ctx_peer->save_ticket == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
                  ,0x11e,"void test_resumption(void)");
  }
  __assert_fail("ctx_peer->decrypt_ticket == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
                ,0x11d,"void test_resumption(void)");
}

Assistant:

static void test_resumption(void)
{
    ptls_encrypt_ticket_t et = {copy_ticket};
    ptls_save_ticket_t st = {save_ticket};

    assert(ctx_peer->ticket_lifetime == 0);
    assert(ctx_peer->max_early_data_size == 0);
    assert(ctx_peer->encrypt_ticket == NULL);
    assert(ctx_peer->decrypt_ticket == NULL);
    assert(ctx_peer->save_ticket == NULL);
    saved_ticket = ptls_iovec_init(NULL, 0);

    ctx_peer->ticket_lifetime = 86400;
    ctx_peer->max_early_data_size = 8192;
    ctx_peer->encrypt_ticket = &et;
    ctx_peer->decrypt_ticket = &et;
    ctx->save_ticket = &st;

    lc_callcnt = 0;
    test_handshake(saved_ticket, 0);
    ok(lc_callcnt == 1);
    ok(saved_ticket.base != NULL);

    /* psk using saved ticket */
    test_handshake(saved_ticket, 0);
    ok(lc_callcnt == 1);

    /* psk-dhe using saved ticket */
    ctx->require_dhe_on_psk = 1;
    test_handshake(saved_ticket, 0);
    ok(lc_callcnt == 1);
    ctx->require_dhe_on_psk = 0;

    /* 0-rtt psk using saved ticket */
    test_handshake(saved_ticket, 1);

    ctx_peer->ticket_lifetime = 0;
    ctx_peer->max_early_data_size = 0;
    ctx_peer->encrypt_ticket = NULL;
    ctx_peer->decrypt_ticket = NULL;
    ctx->save_ticket = NULL;
}